

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_noise_estimate.c
# Opt level: O0

int enable_noise_estimation(AV1_COMP *cpi)

{
  int iVar1;
  AV1_COMP *in_RDI;
  int resize_pending;
  int local_4;
  
  iVar1 = is_frame_resize_pending(in_RDI);
  if (((in_RDI->common).seq_params)->use_highbitdepth == '\0') {
    if ((((((in_RDI->oxcf).pass == AOM_RC_ONE_PASS) && ((in_RDI->oxcf).rc_cfg.mode == AOM_CBR)) &&
         ((in_RDI->oxcf).q_cfg.aq_mode == '\x03')) && ((4 < (in_RDI->oxcf).speed && (iVar1 == 0))))
       && ((in_RDI->ppi->use_svc == 0 &&
           (((in_RDI->oxcf).tune_cfg.content != AOM_CONTENT_SCREEN &&
            (0x383ff < (in_RDI->common).width * (in_RDI->common).height)))))) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int enable_noise_estimation(AV1_COMP *const cpi) {
  const int resize_pending = is_frame_resize_pending(cpi);

#if CONFIG_AV1_HIGHBITDEPTH
  if (cpi->common.seq_params->use_highbitdepth) return 0;
#endif
// Enable noise estimation if denoising is on.
#if CONFIG_AV1_TEMPORAL_DENOISING
  if (cpi->oxcf.noise_sensitivity > 0 && noise_est_svc(cpi) &&
      cpi->common.width >= 320 && cpi->common.height >= 180)
    return 1;
#endif
  // Only allow noise estimate under certain encoding mode.
  // Enabled for 1 pass CBR, speed >=5, and if resolution is same as original.
  // Not enabled for SVC mode and screen_content_mode.
  // Not enabled for low resolutions.
  if (cpi->oxcf.pass == AOM_RC_ONE_PASS && cpi->oxcf.rc_cfg.mode == AOM_CBR &&
      cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ && cpi->oxcf.speed >= 5 &&
      resize_pending == 0 && !cpi->ppi->use_svc &&
      cpi->oxcf.tune_cfg.content != AOM_CONTENT_SCREEN &&
      cpi->common.width * cpi->common.height >= 640 * 360)
    return 1;
  else
    return 0;
}